

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

bool idx2::IsRelative(stref *Path)

{
  char *pcVar1;
  
  if ((0 < Path->Size) &&
     ((pcVar1 = (Path->field_0).Ptr, *pcVar1 == '/' ||
      (((2 < (uint)Path->Size && (pcVar1[1] == ':')) && (pcVar1[2] == '/')))))) {
    return false;
  }
  return true;
}

Assistant:

bool
IsRelative(const stref& Path)
{
  stref& PathR = const_cast<stref&>(Path);
  if (PathR.Size > 0 && PathR[0] == '/') // e.g. /usr/local
    return false;
  if (PathR.Size > 2 && PathR[1] == ':' && PathR[2] == '/') // e.g. C:/Users
    return false;

  return true;
}